

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux.c
# Opt level: O1

int uv_uptime(double *uptime)

{
  int iVar1;
  int *piVar2;
  char local_a8 [8];
  char buf [128];
  timespec now;
  double *uptime_local;
  
  iVar1 = uv__slurp("/proc/uptime",local_a8,0x80);
  if ((iVar1 == 0) && (iVar1 = sscanf(local_a8,"%lf",uptime), iVar1 == 1)) {
    uptime_local._4_4_ = 0;
  }
  else {
    iVar1 = clock_gettime(7,(timespec *)(buf + 0x78));
    if (iVar1 == 0) {
      *uptime = (double)(long)buf._120_8_;
      uptime_local._4_4_ = 0;
    }
    else {
      piVar2 = __errno_location();
      uptime_local._4_4_ = -*piVar2;
    }
  }
  return uptime_local._4_4_;
}

Assistant:

int uv_uptime(double* uptime) {
  struct timespec now;
  char buf[128];

  /* Consult /proc/uptime when present (common case), or fall back to
   * clock_gettime. Why not always clock_gettime? It doesn't always return the
   * right result under OpenVZ and possibly other containerized environments.
   */
  if (0 == uv__slurp("/proc/uptime", buf, sizeof(buf)))
    if (1 == sscanf(buf, "%lf", uptime))
      return 0;

  if (clock_gettime(CLOCK_BOOTTIME, &now))
    return UV__ERR(errno);

  *uptime = now.tv_sec;
  return 0;
}